

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O1

void split_request(char *request)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  
  num_of_request_lines = 0;
  pcVar1 = strchr(request,10);
  sVar3 = num_of_request_lines;
  if (pcVar1 != (char *)0x0) {
    lVar2 = 0x125141;
    sVar3 = 0;
    do {
      memcpy((void *)(lVar2 + -1),request,(size_t)(pcVar1 + (1 - (long)request)));
      pcVar1[lVar2 - (long)request] = '\0';
      sVar3 = sVar3 + 1;
      request = pcVar1 + 1;
      pcVar1 = strchr(request,10);
      lVar2 = lVar2 + 100;
    } while (pcVar1 != (char *)0x0);
  }
  num_of_request_lines = sVar3;
  return;
}

Assistant:

static void split_request(const char *request)
{
	num_of_request_lines = 0;
	const char *from = request;
	const char *to = strchr(request, '\n');
	while (to != NULL) {
		ptrdiff_t bytes_to_copy = to - from + 1;
		memcpy(line_buffer[num_of_request_lines], from, (size_t)bytes_to_copy);
		line_buffer[num_of_request_lines][bytes_to_copy] = '\0';
		num_of_request_lines++;
		to++;
		from = to;
		to = strchr(to, '\n');
	}
}